

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

void __thiscall PlayerStrategy::PlayerStrategy(PlayerStrategy *this,PlayerStrategy *toCopy)

{
  string *psVar1;
  pointer pcVar2;
  Country *pCVar3;
  int *piVar4;
  string *psVar5;
  
  this->_vptr_PlayerStrategy = (_func_int **)&PTR___cxa_pure_virtual_0013c820;
  piVar4 = (int *)operator_new(4);
  *piVar4 = -1;
  this->numWeakest = piVar4;
  piVar4 = toCopy->exchangingCardType;
  this->armiesToPlace = toCopy->armiesToPlace;
  this->exchangingCardType = piVar4;
  pCVar3 = toCopy->from;
  this->player = toCopy->player;
  this->from = pCVar3;
  this->to = toCopy->to;
  psVar5 = (string *)operator_new(0x20);
  psVar1 = toCopy->strategyName;
  (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar5,pcVar2,pcVar2 + psVar1->_M_string_length);
  this->strategyName = psVar5;
  return;
}

Assistant:

PlayerStrategy::PlayerStrategy(const PlayerStrategy& toCopy) {
    this->exchangingCardType = toCopy.exchangingCardType;
    this->armiesToPlace = toCopy.armiesToPlace;
    this->player = toCopy.player;
    this->from = toCopy.from;
    this->to = toCopy.to;
    this->strategyName = new std::string(toCopy.getStrategyName());
}